

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

int ON_2dSize::ComparePointer(ON_2dSize *lhs,ON_2dSize *rhs)

{
  ON_2dSize *rhs_local;
  ON_2dSize *lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_2dSize *)0x0) {
    lhs_local._4_4_ = -1;
  }
  else if (rhs == (ON_2dSize *)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs->cx <= lhs->cx) {
    if (lhs->cx < rhs->cx || lhs->cx == rhs->cx) {
      if (rhs->cy <= lhs->cy) {
        if (lhs->cy < rhs->cy || lhs->cy == rhs->cy) {
          lhs_local._4_4_ = 0;
        }
        else {
          lhs_local._4_4_ = 1;
        }
      }
      else {
        lhs_local._4_4_ = -1;
      }
    }
    else {
      lhs_local._4_4_ = 1;
    }
  }
  else {
    lhs_local._4_4_ = -1;
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_2dSize::ComparePointer(
  const ON_2dSize* lhs,
  const ON_2dSize* rhs
)
{
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return -1;
  if (nullptr == rhs)
    return 1;
  if (lhs->cx < rhs->cx)
    return -1;
  if (lhs->cx > rhs->cx)
    return 1;
  if (lhs->cy < rhs->cy)
    return -1;
  if (lhs->cy > rhs->cy)
    return 1;
  return 0;
}